

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_array_toString(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  int iVar2;
  int64_t iVar3;
  ulong uVar4;
  JSValueUnion JVar5;
  JSValue JVar6;
  JSValue val;
  JSValue JVar7;
  
  JVar6 = JS_ToObject(ctx,this_val);
  if ((uint)JVar6.tag == 6) {
    iVar3 = 6;
    JVar5.float64 = 0.0;
  }
  else {
    iVar2 = 0x5b;
    JVar7 = JVar6;
    val = JS_GetPropertyInternal(ctx,JVar6,0x5b,JVar6,0);
    if ((uint)val.tag == 6) {
      JVar7 = (JSValue)(ZEXT816(6) << 0x40);
      uVar4 = 0;
    }
    else {
      iVar1 = JS_IsFunction(ctx,val);
      JVar5 = JVar7.u;
      if (iVar1 == 0) {
        if (0xfffffff4 < (uint)val.tag) {
          iVar2 = *val.u.ptr;
          *(int *)val.u.ptr = iVar2 + -1;
          if (iVar2 < 2) {
            __JS_FreeValueRT(ctx->rt,val);
          }
        }
        JVar7 = js_object_toString(ctx,JVar6,iVar2,(JSValue *)JVar5.ptr);
      }
      else {
        JVar7 = JS_CallFree(ctx,val,JVar6,0,(JSValue *)0x0);
      }
      uVar4 = (ulong)JVar7.u.ptr & 0xffffffff00000000;
    }
    iVar3 = JVar7.tag;
    if ((0xfffffff4 < (uint)JVar6.tag) &&
       (iVar2 = *JVar6.u.ptr, *(int *)JVar6.u.ptr = iVar2 + -1, iVar2 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar6);
    }
    JVar5.ptr = (void *)(uVar4 | (ulong)JVar7.u.ptr & 0xffffffff);
  }
  JVar6.tag = iVar3;
  JVar6.u.float64 = JVar5.float64;
  return JVar6;
}

Assistant:

static JSValue js_array_toString(JSContext *ctx, JSValueConst this_val,
                                 int argc, JSValueConst *argv)
{
    JSValue obj, method, ret;

    obj = JS_ToObject(ctx, this_val);
    if (JS_IsException(obj))
        return JS_EXCEPTION;
    method = JS_GetProperty(ctx, obj, JS_ATOM_join);
    if (JS_IsException(method)) {
        ret = JS_EXCEPTION;
    } else
    if (!JS_IsFunction(ctx, method)) {
        /* Use intrinsic Object.prototype.toString */
        JS_FreeValue(ctx, method);
        ret = js_object_toString(ctx, obj, 0, NULL);
    } else {
        ret = JS_CallFree(ctx, method, obj, 0, NULL);
    }
    JS_FreeValue(ctx, obj);
    return ret;
}